

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolact.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  vector<Object,_std::allocator<Object>_> *objects_00;
  pointer *ppfVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  byte bVar8;
  char *pcVar9;
  long lVar10;
  undefined1 auVar11 [16];
  int iVar12;
  int *piVar13;
  bool bVar14;
  pointer piVar15;
  Size __first;
  char cVar16;
  int iVar17;
  int iVar18;
  size_type __new_size;
  float *pfVar19;
  pointer pOVar20;
  size_t sVar21;
  ulong uVar22;
  void *pvVar23;
  uint uVar24;
  byte *pbVar25;
  uint uVar26;
  int iVar27;
  int iVar28;
  ulong uVar29;
  long lVar30;
  float *mp;
  int j;
  int iVar31;
  ulong uVar32;
  long lVar33;
  long lVar34;
  pointer pOVar35;
  pointer pOVar36;
  ulong uVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  pointer pfVar41;
  __m128 t_2;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  pointer pfVar44;
  float fVar47;
  __m128 t;
  float fVar48;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar49;
  float fVar53;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  vector<Object,_std::allocator<Object>_> objects;
  float local_538;
  float fStack_534;
  Extractor ex;
  float local_508;
  float fStack_504;
  vector<int,_std::allocator<int>_> picked;
  long *local_4b0;
  undefined1 local_480 [8];
  _InputArray local_478;
  undefined8 uStack_460;
  vector<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
  class_candidates;
  Mat local_3f8;
  Size label_size;
  Mat local_358;
  Mat local_308;
  Mat local_2b8;
  long local_270;
  int baseLine;
  undefined4 uStack_260;
  undefined4 uStack_25c;
  undefined4 local_258;
  undefined4 uStack_254;
  int iStack_250;
  Allocator *local_248;
  int iStack_240;
  int iStack_23c;
  int iStack_238;
  undefined8 uStack_234;
  size_t local_228;
  undefined4 local_220 [2];
  Mat *local_218;
  undefined8 local_210;
  vector<float,_std::allocator<float>_> areas;
  Mat local_1d8 [208];
  Net yolact;
  Mat m;
  uint local_a8;
  uint uStack_a4;
  uchar *local_a0;
  float norm_vals [3];
  float mean_vals [3];
  
  if (argc == 2) {
    pcVar9 = argv[1];
    std::__cxx11::string::string((string *)&areas,pcVar9,(allocator *)&picked);
    cv::imread((string *)&m,(int)&areas);
    if ((pointer *)
        areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        &areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage) {
      operator_delete(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    cVar16 = cv::Mat::empty();
    if (cVar16 == '\0') {
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ncnn::Net::Net(&yolact);
      yolact.opt.use_vulkan_compute = true;
      iVar17 = ncnn::Net::load_param(&yolact,"yolact.param");
      if ((iVar17 != 0) || (iVar17 = ncnn::Net::load_model(&yolact,"yolact.bin"), iVar17 != 0)) {
        exit(-1);
      }
      ncnn::Mat::from_pixels_resize
                (&local_2b8,local_a0,0x10002,uStack_a4,local_a8,0x226,0x226,(Allocator *)0x0);
      mean_vals[0] = 123.68;
      mean_vals[1] = 116.78;
      mean_vals[2] = 103.94;
      norm_vals[0] = 0.017123288;
      norm_vals[1] = 0.017507004;
      norm_vals[2] = 0.017427675;
      ncnn::Mat::substract_mean_normalize(&local_2b8,mean_vals,norm_vals);
      ncnn::Net::create_extractor((Net *)&ex);
      ncnn::Extractor::input(&ex,"input.1",&local_2b8);
      local_308.cstep = 0;
      local_308.data = (void *)0x0;
      local_308.refcount._0_4_ = 0;
      local_308.refcount._4_4_ = 0;
      local_308.elemsize._0_4_ = 0;
      local_308.elemsize._4_4_ = 0;
      local_308.elempack = 0;
      local_308.allocator = (Allocator *)0x0;
      local_308.dims = 0;
      local_308.w = 0;
      local_308.h = 0;
      local_308.d = 0;
      local_308.c = 0;
      local_358.cstep = 0;
      local_358.data = (void *)0x0;
      local_358.refcount._0_4_ = 0;
      local_358.refcount._4_4_ = 0;
      local_358.elemsize._0_4_ = 0;
      local_358.elemsize._4_4_ = 0;
      local_358.elempack = 0;
      local_358.allocator = (Allocator *)0x0;
      local_358.dims = 0;
      local_358.w = 0;
      local_358.h = 0;
      local_358.d = 0;
      local_358.c = 0;
      label_size.width = 0;
      label_size.height = 0;
      local_3f8.cstep = 0;
      local_3f8.data = (void *)0x0;
      local_3f8.refcount._0_4_ = 0;
      local_3f8.refcount._4_4_ = 0;
      local_3f8.elemsize._0_4_ = 0;
      local_3f8.elemsize._4_4_ = 0;
      local_3f8.elempack = 0;
      local_3f8.allocator = (Allocator *)0x0;
      local_3f8.dims = 0;
      local_3f8.w = 0;
      local_3f8.h = 0;
      local_3f8.d = 0;
      local_3f8.c = 0;
      ncnn::Extractor::extract(&ex,"619",&local_308,0);
      ncnn::Extractor::extract(&ex,"816",&local_358,0);
      ncnn::Extractor::extract(&ex,"818",(Mat *)&label_size,0);
      ncnn::Extractor::extract(&ex,"820",&local_3f8,0);
      iVar27 = local_3f8.h;
      iVar17 = local_3f8.w;
      __new_size = (size_type)local_3f8.w;
      uVar29 = (ulong)(uint)local_3f8.h;
      local_228 = 0;
      _baseLine = (float *)0x0;
      uStack_260 = 0;
      uStack_25c = 0;
      local_258 = 0;
      uStack_254 = 0;
      iStack_250 = 0;
      local_248 = (Allocator *)0x0;
      iStack_240 = 0;
      iStack_23c = 0;
      iStack_238 = 0;
      uStack_234._0_4_ = 0;
      uStack_234._4_4_ = 0;
      ncnn::Mat::create((Mat *)&baseLine,4,local_3f8.h,4,(Allocator *)0x0);
      lVar33 = 0;
      pfVar19 = _baseLine;
      do {
        fVar40 = (float)(&DAT_005a4470)[lVar33];
        iVar18 = (&DAT_005a4450)[lVar33];
        iVar12 = iVar18;
        if (iVar18 < 2) {
          iVar12 = 1;
        }
        iVar28 = 0;
        local_270 = lVar33;
        do {
          iVar31 = 0;
          do {
            lVar33 = 0;
            do {
              fVar38 = *(float *)((long)&DAT_005a4464 + lVar33);
              if (fVar38 < 0.0) {
                fVar38 = sqrtf(fVar38);
              }
              else {
                fVar38 = SQRT(fVar38);
              }
              fVar38 = (fVar38 * fVar40) / 550.0;
              *pfVar19 = ((float)iVar31 + 0.5) / (float)iVar18;
              pfVar19[1] = ((float)iVar28 + 0.5) / (float)iVar18;
              pfVar19[2] = fVar38;
              pfVar19[3] = fVar38;
              pfVar19 = pfVar19 + 4;
              lVar33 = lVar33 + 4;
            } while (lVar33 != 0xc);
            iVar31 = iVar31 + 1;
          } while (iVar31 != iVar12);
          iVar28 = iVar28 + 1;
        } while (iVar28 != iVar12);
        lVar33 = local_270 + 1;
      } while (lVar33 != 5);
      class_candidates.
      super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
      ._M_impl.super__Vector_impl_data._0_16_ = ZEXT416(0);
      class_candidates.
      super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
      ::resize(&class_candidates,__new_size);
      if (0 < iVar27) {
        uVar32 = 0;
        do {
          pfVar19 = _baseLine;
          pvVar23 = local_358.data;
          __first = label_size;
          if (1 < iVar17) {
            lVar33 = (long)local_358.w * uVar32 *
                     CONCAT44(local_358.elemsize._4_4_,(undefined4)local_358.elemsize);
            lVar34 = (long)iStack_23c * uVar32 * CONCAT44(uStack_254,local_258);
            fVar40 = 0.0;
            uVar37 = 0;
            uVar22 = 1;
            do {
              fVar38 = *(float *)((long)local_3f8.data +
                                 uVar22 * 4 +
                                 CONCAT44(local_3f8.elemsize._4_4_,(undefined4)local_3f8.elemsize) *
                                 uVar32 * (long)local_3f8.w);
              if (fVar40 < fVar38) {
                uVar37 = uVar22 & 0xffffffff;
                fVar40 = fVar38;
              }
              uVar22 = uVar22 + 1;
            } while ((uint)iVar17 != uVar22);
            iVar27 = (int)uVar37;
            if ((iVar27 != 0) && (0.05 < fVar40)) {
              fVar38 = expf(*(float *)((long)local_358.data + lVar33 + 8) * 0.2);
              fVar39 = expf(*(float *)((long)pvVar23 + lVar33 + 0xc) * 0.2);
              uVar4 = *(undefined8 *)((long)pfVar19 + lVar34);
              uVar5 = *(undefined8 *)((long)pfVar19 + lVar34 + 8);
              fVar47 = (float)uVar5;
              fVar48 = (float)((ulong)uVar5 >> 0x20);
              uVar5 = *(undefined8 *)((long)pvVar23 + lVar33);
              fVar49 = (float)uVar5 * 0.1 * fVar47 + (float)uVar4;
              fVar53 = (float)((ulong)uVar5 >> 0x20) * 0.1 * fVar48 + (float)((ulong)uVar4 >> 0x20);
              fVar38 = fVar38 * fVar47 * 0.5;
              fVar39 = fVar39 * fVar48 * 0.5;
              fVar47 = extraout_XMM0_Db * 0.0 * 0.0;
              fVar48 = extraout_XMM0_Db_00 * 0.0 * 0.0;
              auVar42._0_4_ = (fVar49 - fVar38) * (float)(int)uStack_a4;
              auVar42._4_4_ = (fVar53 - fVar39) * (float)(int)local_a8;
              auVar42._8_4_ = (0.0 - fVar47) * 0.0;
              auVar42._12_4_ = (0.0 - fVar48) * 0.0;
              auVar45._0_8_ = CONCAT44((float)(int)(local_a8 - 1),(float)(int)(uStack_a4 - 1));
              auVar45._8_4_ = 0xbf800000;
              auVar45._12_4_ = 0xbf800000;
              auVar50._8_4_ = 0xbf800000;
              auVar50._0_8_ = auVar45._0_8_;
              auVar50._12_4_ = 0xbf800000;
              auVar51 = minps(auVar50,auVar42);
              auVar42 = maxps(ZEXT816(0),auVar51);
              auVar51._4_4_ = (fVar39 + fVar53) * (float)(int)local_a8;
              auVar51._0_4_ = (fVar38 + fVar49) * (float)(int)uStack_a4;
              auVar51._8_4_ = (fVar47 + 0.0) * 0.0;
              auVar51._12_4_ = (fVar48 + 0.0) * 0.0;
              auVar51 = minps(auVar45,auVar51);
              auVar51 = maxps(ZEXT816(0),auVar51);
              areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              cv::Mat::Mat(local_1d8);
              local_538 = auVar42._0_4_;
              fStack_534 = auVar42._4_4_;
              local_508 = auVar51._0_4_;
              fStack_504 = auVar51._4_4_;
              areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start = auVar42._0_8_;
              areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   (pointer)CONCAT44((fStack_504 - fStack_534) + 1.0,(local_508 - local_538) + 1.0);
              areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(fVar40,iVar27);
              std::vector<float,std::allocator<float>>::vector<float_const*,void>
                        ((vector<float,std::allocator<float>> *)&picked,(float *)__first,
                         (float *)__first,(allocator_type *)&local_478);
              piVar15 = picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage = (pointer)0x0;
              picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish = (pointer)0x0;
              picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start = (pointer)0x0;
              std::vector<Object,_std::allocator<Object>_>::push_back
                        (class_candidates.
                         super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + iVar27,(value_type *)&areas);
              cv::Mat::~Mat(local_1d8);
              if (piVar15 != (pointer)0x0) {
                operator_delete(piVar15);
              }
            }
          }
          uVar32 = uVar32 + 1;
        } while (uVar32 != uVar29);
      }
      std::vector<Object,_std::allocator<Object>_>::_M_erase_at_end
                (&objects,objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                          super__Vector_impl_data._M_start);
      if (0 < (int)((ulong)((long)class_candidates.
                                  super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)class_candidates.
                                 super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555) {
        lVar33 = 0;
        do {
          objects_00 = class_candidates.
                       super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar33;
          pOVar20 = (objects_00->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          pOVar36 = (objects_00->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
          if (pOVar20 != pOVar36) {
            qsort_descent_inplace
                      (objects_00,0,
                       (int)((ulong)((long)pOVar36 - (long)pOVar20) >> 4) * 0x38e38e39 + -1);
          }
          picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          uVar26 = (int)((long)(objects_00->super__Vector_base<Object,_std::allocator<Object>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(objects_00->super__Vector_base<Object,_std::allocator<Object>_>).
                               _M_impl.super__Vector_impl_data._M_start >> 4) * 0x38e38e39;
          std::vector<float,_std::allocator<float>_>::vector
                    (&areas,(long)(int)uVar26,(allocator_type *)&local_478);
          if (0 < (int)uVar26) {
            pfVar19 = &(((objects_00->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
                         super__Vector_impl_data._M_start)->rect).height;
            uVar29 = 0;
            do {
              areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[uVar29] = pfVar19[-1] * *pfVar19;
              uVar29 = uVar29 + 1;
              pfVar19 = pfVar19 + 0x24;
            } while ((uVar26 & 0x7fffffff) != uVar29);
            local_478._0_8_ = local_478._0_8_ & 0xffffffff00000000;
            iVar17 = 0;
            do {
              uVar24 = (uint)((ulong)((long)picked.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_finish -
                                     (long)picked.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_start) >> 2);
              if ((int)uVar24 < 1) {
LAB_00127748:
                if (picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)&picked,
                             (iterator)
                             picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish,&local_478.flags);
                }
                else {
                  *picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish = iVar17;
                  picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                }
              }
              else {
                pOVar20 = (objects_00->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
                          super__Vector_impl_data._M_start;
                pOVar36 = pOVar20 + iVar17;
                bVar14 = true;
                uVar29 = 0;
                do {
                  iVar27 = picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar29];
                  if (pOVar36->label == pOVar20[iVar27].label) {
                    pOVar35 = pOVar20 + iVar27;
                    uVar32._0_4_ = (pOVar36->rect).x;
                    uVar32._4_4_ = (pOVar36->rect).y;
                    auVar46._8_8_ = 0;
                    auVar46._0_8_ = uVar32;
                    uVar2 = (pOVar36->rect).width;
                    uVar6 = (pOVar36->rect).height;
                    uVar37._0_4_ = (pOVar35->rect).x;
                    uVar37._4_4_ = (pOVar35->rect).y;
                    auVar52._8_8_ = 0;
                    auVar52._0_8_ = uVar37;
                    uVar3 = (pOVar35->rect).width;
                    uVar7 = (pOVar35->rect).height;
                    auVar43._0_4_ = (float)uVar3 + (float)(undefined4)uVar37;
                    auVar43._4_4_ = (float)uVar7 + (float)uVar37._4_4_;
                    auVar43._8_8_ = 0;
                    auVar42 = maxps(auVar52,auVar46);
                    auVar11._4_4_ = (float)uVar6 + (float)uVar32._4_4_;
                    auVar11._0_4_ = (float)uVar2 + (float)(undefined4)uVar32;
                    auVar11._8_8_ = 0;
                    auVar51 = minps(auVar43,auVar11);
                    fVar40 = auVar51._0_4_ - auVar42._0_4_;
                    fVar39 = auVar51._4_4_ - auVar42._4_4_;
                    fVar38 = 0.0;
                    if (0.0 < fVar39 && 0.0 < fVar40) {
                      fVar38 = fVar40 * fVar39;
                    }
                    if (0.5 < fVar38 / ((areas.super__Vector_base<float,_std::allocator<float>_>.
                                         _M_impl.super__Vector_impl_data._M_start[iVar17] +
                                        areas.super__Vector_base<float,_std::allocator<float>_>.
                                        _M_impl.super__Vector_impl_data._M_start[iVar27]) - fVar38))
                    {
                      bVar14 = false;
                    }
                  }
                  uVar29 = uVar29 + 1;
                } while ((uVar24 & 0x7fffffff) != uVar29);
                if (bVar14) goto LAB_00127748;
              }
              iVar17 = local_478.flags + 1;
              local_478.flags = iVar17;
            } while (iVar17 < (int)uVar26);
          }
          if (areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (0 < (int)((ulong)((long)picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_finish -
                               (long)picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start) >> 2)) {
            lVar34 = 0;
            do {
              std::vector<Object,_std::allocator<Object>_>::push_back
                        (&objects,(objects_00->super__Vector_base<Object,_std::allocator<Object>_>).
                                  _M_impl.super__Vector_impl_data._M_start +
                                  picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start[lVar34]);
              lVar34 = lVar34 + 1;
            } while (lVar34 < (int)((ulong)((long)picked.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                           (long)picked.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start) >> 2));
          }
          if (picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start != (pointer)0x0) {
            operator_delete(picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          lVar33 = lVar33 + 1;
        } while (lVar33 < (int)((ulong)((long)class_candidates.
                                              super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)class_candidates.
                                             super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                          -0x55555555);
      }
      pOVar20 = objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start !=
          objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        qsort_descent_inplace
                  (&objects,0,
                   (int)((ulong)((long)objects.super__Vector_base<Object,_std::allocator<Object>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                (long)objects.super__Vector_base<Object,_std::allocator<Object>_>.
                                      _M_impl.super__Vector_impl_data._M_start) >> 4) * 0x38e38e39 +
                   -1);
        pOVar20 = objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      iVar17 = (int)((ulong)((long)pOVar20 -
                            (long)objects.super__Vector_base<Object,_std::allocator<Object>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 4) * 0x38e38e39;
      if (200 < iVar17) {
        std::vector<Object,_std::allocator<Object>_>::resize(&objects,200);
        iVar17 = (int)((ulong)((long)objects.super__Vector_base<Object,_std::allocator<Object>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)objects.super__Vector_base<Object,_std::allocator<Object>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 4) * 0x38e38e39;
      }
      if (0 < iVar17) {
        lVar33 = 0;
        do {
          pOVar20 = objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                    super__Vector_impl_data._M_start;
          cv::Mat::Mat((Mat *)&areas,local_308.h,local_308.w,5);
          picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          cv::Mat::operator=((Mat *)&areas,(Scalar_ *)&picked);
          pOVar20 = pOVar20 + lVar33;
          if (0 < (long)local_308.c) {
            pfVar41 = (pOVar20->maskdata).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start;
            lVar34 = 0;
            pvVar23 = local_308.data;
            do {
              if (0 < local_308.h * local_308.w) {
                fVar40 = pfVar41[lVar34];
                uVar29 = 0;
                do {
                  areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[uVar29] =
                       *(float *)((long)pvVar23 + uVar29 * 4) * fVar40 +
                       areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage[uVar29];
                  uVar29 = uVar29 + 1;
                } while ((uint)(local_308.h * local_308.w) != uVar29);
              }
              lVar34 = lVar34 + 1;
              pvVar23 = (void *)((long)pvVar23 +
                                CONCAT44(local_308.elemsize._4_4_,(undefined4)local_308.elemsize) *
                                local_308.cstep);
            } while (lVar34 != local_308.c);
          }
          cv::Mat::Mat((Mat *)&picked);
          local_478.sz.width = 0;
          local_478.sz.height = 0;
          local_478.flags = 0x1010000;
          local_478.obj = &areas;
          local_210 = 0;
          local_220[0] = 0x2010000;
          local_218 = (Mat *)&picked;
          cv::resize((Mat *)&local_478,local_220,local_480);
          cv::Mat::Mat((Mat *)&local_478,local_a8,uStack_a4,0);
          cv::Mat::operator=(&pOVar20->mask,(Mat *)&local_478);
          cv::Mat::~Mat((Mat *)&local_478);
          local_478.sz.width = 0;
          local_478.sz.height = 0;
          uStack_460 = 0;
          local_478._0_8_ = (Size *)0x0;
          local_478.obj = (vector<int,_std::allocator<int>_> *)0x0;
          cv::Mat::operator=(&pOVar20->mask,(Scalar_ *)&local_478);
          if (0 < (int)local_a8) {
            uVar29 = 0;
            do {
              fVar40 = (pOVar20->rect).y;
              if (((fVar40 <= (float)(int)uVar29) &&
                  ((float)(int)uVar29 <= fVar40 + (pOVar20->rect).height)) && (0 < (int)uStack_a4))
              {
                lVar34 = **(long **)&pOVar20->field_0x78;
                lVar10 = *(long *)&pOVar20->field_0x40;
                lVar30 = *local_4b0;
                uVar32 = 0;
                do {
                  fVar40 = (pOVar20->rect).x;
                  if ((fVar40 <= (float)(int)uVar32) &&
                     ((float)(int)uVar32 <= fVar40 + (pOVar20->rect).width)) {
                    *(char *)(lVar34 * uVar29 + lVar10 + uVar32) =
                         -(0.5 < *(float *)((long)picked.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage
                                           + uVar32 * 4 + lVar30 * uVar29));
                  }
                  uVar32 = uVar32 + 1;
                } while (uStack_a4 != uVar32);
              }
              uVar29 = uVar29 + 1;
            } while (uVar29 != local_a8);
          }
          cv::Mat::~Mat((Mat *)&picked);
          cv::Mat::~Mat((Mat *)&areas);
          lVar33 = lVar33 + 1;
        } while (lVar33 < (int)((ulong)((long)objects.
                                              super__Vector_base<Object,_std::allocator<Object>_>.
                                              _M_impl.super__Vector_impl_data._M_finish -
                                       (long)objects.
                                             super__Vector_base<Object,_std::allocator<Object>_>.
                                             _M_impl.super__Vector_impl_data._M_start) >> 4) *
                          0x38e38e39);
      }
      std::
      vector<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
      ::~vector(&class_candidates);
      piVar13 = (int *)CONCAT44(uStack_25c,uStack_260);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if (local_248 == (Allocator *)0x0) {
            if (_baseLine != (float *)0x0) {
              free(_baseLine);
            }
          }
          else {
            (*local_248->_vptr_Allocator[3])();
          }
        }
      }
      piVar13 = (int *)CONCAT44(local_3f8.refcount._4_4_,local_3f8.refcount._0_4_);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if (local_3f8.allocator == (Allocator *)0x0) {
            if (local_3f8.data != (void *)0x0) {
              free(local_3f8.data);
            }
          }
          else {
            (*(local_3f8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar13 = (int *)CONCAT44(local_358.refcount._4_4_,(int)local_358.refcount);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if (local_358.allocator == (Allocator *)0x0) {
            if (local_358.data != (void *)0x0) {
              free(local_358.data);
            }
          }
          else {
            (*(local_358.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar13 = (int *)CONCAT44(local_308.refcount._4_4_,(int)local_308.refcount);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if (local_308.allocator == (Allocator *)0x0) {
            if (local_308.data != (void *)0x0) {
              free(local_308.data);
            }
          }
          else {
            (*(local_308.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      ncnn::Extractor::~Extractor(&ex);
      if ((vector<int,_std::allocator<int>_> *)local_2b8.refcount !=
          (vector<int,_std::allocator<int>_> *)0x0) {
        LOCK();
        *(int *)&(((_Vector_base<int,_std::allocator<int>_> *)local_2b8.refcount)->_M_impl).
                 super__Vector_impl_data._M_start =
             *(int *)&(((_Vector_base<int,_std::allocator<int>_> *)local_2b8.refcount)->_M_impl).
                      super__Vector_impl_data._M_start + -1;
        UNLOCK();
        if (*(int *)&(((_Vector_base<int,_std::allocator<int>_> *)local_2b8.refcount)->_M_impl).
                     super__Vector_impl_data._M_start == 0) {
          if (local_2b8.allocator == (Allocator *)0x0) {
            if (local_2b8.data != (void *)0x0) {
              free(local_2b8.data);
            }
          }
          else {
            (*(local_2b8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      ncnn::Net::~Net(&yolact);
      cv::Mat::clone();
      if (objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start) {
        iVar17 = 0;
        uVar29 = 0;
        pOVar20 = objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        pOVar36 = objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          if (0.15 <= (double)pOVar36[uVar29].prob) {
            pOVar20 = pOVar36 + uVar29;
            fprintf(_stderr,"%d = %.5f at %.2f %.2f %.2f x %.2f\n",(double)pOVar36[uVar29].prob,
                    (double)(pOVar20->rect).x,SUB84((double)(pOVar20->rect).y,0),
                    (double)(pOVar20->rect).width,SUB84((double)(pOVar20->rect).height,0),
                    (ulong)(uint)pOVar20->label);
            local_478.sz.width = 0;
            local_478.sz.height = 0;
            local_478.flags = 0x3010000;
            local_308.refcount._0_4_ = (int)ROUND((pOVar20->rect).width);
            lVar33 = (long)(iVar17 % 0x51) * 3;
            local_308.refcount._4_4_ = (int)ROUND((pOVar20->rect).height);
            local_308.data =
                 (void *)CONCAT44((int)ROUND((pOVar20->rect).y),(int)ROUND((pOVar20->rect).x));
            bVar8 = draw_objects(cv::Mat_const&,std::vector<Object,std::allocator<Object>>const&)::
                    colors[lVar33 + 2];
            pfVar41 = (pointer)(double)(*(ushort *)
                                         (draw_objects(cv::Mat_const&,std::vector<Object,std::allocator<Object>>const&)
                                          ::colors + lVar33) & 0xff);
            pfVar44 = (pointer)(double)(byte)(*(ushort *)
                                               (draw_objects(cv::Mat_const&,std::vector<Object,std::allocator<Object>>const&)
                                                ::colors + lVar33) >> 8);
            local_478.obj = &picked;
            areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_start = pfVar41;
            areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_finish = pfVar44;
            areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = (pointer)(double)bVar8;
            cv::rectangle((string *)&local_478,&local_308,&areas,1,8,0);
            sprintf((char *)&areas,"%s %.1f%%",(double)(pOVar20->prob * 100.0),
                    _ZZL12draw_objectsRKN2cv3MatERKSt6vectorI6ObjectSaIS4_EEE11class_names_rel +
                    *(int *)(
                            _ZZL12draw_objectsRKN2cv3MatERKSt6vectorI6ObjectSaIS4_EEE11class_names_rel
                            + (long)pOVar20->label * 4));
            _baseLine = (float *)((ulong)_baseLine & 0xffffffff00000000);
            local_478._0_8_ = &local_478.sz;
            sVar21 = strlen((char *)&areas);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_478,&areas,
                       (long)&areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start + sVar21);
            cv::getTextSize((string *)&label_size,(int)(string *)&local_478,0.5,0,(int *)0x1);
            if ((Size *)local_478._0_8_ != &local_478.sz) {
              operator_delete((void *)local_478._0_8_);
            }
            iVar18 = (int)(pOVar20->rect).x;
            iVar27 = (int)(((pOVar20->rect).y - (float)label_size.height) - (float)baseLine);
            if (iVar27 < 1) {
              iVar27 = 0;
            }
            iVar12 = picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish._4_4_ - label_size.width;
            if (label_size.width + iVar18 <=
                picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_finish._4_4_) {
              iVar12 = iVar18;
            }
            local_2b8.elemsize = 0;
            local_2b8.data._0_4_ = 0x3010000;
            local_358.refcount._4_4_ = baseLine + label_size.height;
            local_358.data = (void *)CONCAT44(iVar27,iVar12);
            local_358.refcount._0_4_ = label_size.width;
            local_478._0_8_ = (Size *)0x406fe00000000000;
            local_478.obj = (vector<int,_std::allocator<int>_> *)0x406fe00000000000;
            local_478.sz.width = 0;
            local_478.sz.height = 0x406fe000;
            uStack_460 = 0;
            local_2b8.refcount = (int *)&picked;
            cv::rectangle(&local_2b8,&local_358,(string *)&local_478,0xffffffff,8,0);
            local_2b8.elemsize = 0;
            local_2b8.data = (void *)CONCAT44(local_2b8.data._4_4_,0x3010000);
            local_478._0_8_ = &local_478.sz;
            local_2b8.refcount = (int *)&picked;
            sVar21 = strlen((char *)&areas);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_478,&areas,
                       (long)&areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start + sVar21);
            local_3f8.data = (void *)CONCAT44(iVar27 + label_size.height,iVar12);
            yolact._vptr_Net = (_func_int **)0x0;
            yolact.opt.lightmode = false;
            yolact.opt.use_shader_pack8 = false;
            yolact.opt.use_subgroup_ops = false;
            yolact.opt.use_reserved_0 = false;
            yolact.opt.num_threads = 0;
            yolact.opt.blob_allocator = (Allocator *)0x0;
            yolact.opt.workspace_allocator = (Allocator *)0x0;
            cv::putText(0x3fe0000000000000,&local_2b8,(string *)&local_478,&local_3f8,0,&yolact,1,8,
                        0);
            if ((Size *)local_478._0_8_ != &local_478.sz) {
              operator_delete((void *)local_478._0_8_);
            }
            if (0 < (int)picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish) {
              lVar33 = 0;
              do {
                if (0 < picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish._4_4_) {
                  lVar34 = **(long **)&pOVar20->field_0x78;
                  lVar10 = *(long *)&pOVar20->field_0x40;
                  pbVar25 = (byte *)((long)picked.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_end_of_storage +
                                    *local_4b0 * lVar33 + 2);
                  lVar30 = 0;
                  do {
                    if (*(char *)(lVar34 * lVar33 + lVar10 + lVar30) == -1) {
                      iVar27 = (int)ROUND((double)pbVar25[-2] * 0.5 + (double)pfVar41 * 0.5);
                      if (iVar27 < 1) {
                        iVar27 = 0;
                      }
                      if (0xfe < iVar27) {
                        iVar27 = 0xff;
                      }
                      pbVar25[-2] = (byte)iVar27;
                      iVar27 = (int)ROUND((double)pbVar25[-1] * 0.5 + (double)pfVar44 * 0.5);
                      if (iVar27 < 1) {
                        iVar27 = 0;
                      }
                      if (0xfe < iVar27) {
                        iVar27 = 0xff;
                      }
                      pbVar25[-1] = (byte)iVar27;
                      iVar27 = (int)ROUND((double)*pbVar25 * 0.5 + (double)bVar8 * 0.5);
                      if (iVar27 < 1) {
                        iVar27 = 0;
                      }
                      if (0xfe < iVar27) {
                        iVar27 = 0xff;
                      }
                      *pbVar25 = (byte)iVar27;
                    }
                    lVar30 = lVar30 + 1;
                    pbVar25 = pbVar25 + 3;
                  } while (lVar30 < picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish._4_4_);
                }
                lVar33 = lVar33 + 1;
              } while (lVar33 < (int)picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish);
            }
            iVar17 = iVar17 + 1;
            pOVar20 = objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            pOVar36 = objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                      super__Vector_impl_data._M_start;
          }
          uVar29 = uVar29 + 1;
        } while (uVar29 < (ulong)(((long)pOVar20 - (long)pOVar36 >> 4) * -0x71c71c71c71c71c7));
      }
      ppfVar1 = &areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x702e746c75736572;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0xa;
      local_478.sz.width = 0;
      local_478.sz.height = 0;
      local_478.flags = 0x1010000;
      local_2b8.elemsize = 0;
      local_2b8.data = (void *)0x0;
      local_2b8.refcount = (int *)0x0;
      local_478.obj = &picked;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)ppfVar1;
      cv::imwrite((string *)&areas,&local_478,(vector *)&local_2b8);
      if (local_2b8.data != (void *)0x0) {
        operator_delete(local_2b8.data);
      }
      if ((pointer *)
          areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_start != ppfVar1) {
        operator_delete(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)CONCAT26(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._6_2_,0x6567616d69);
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x5;
      local_478.sz.width = 0;
      local_478.sz.height = 0;
      local_478.flags = 0x1010000;
      local_478.obj = &picked;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)ppfVar1;
      cv::imshow((string *)&areas,&local_478);
      if ((pointer *)
          areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_start != ppfVar1) {
        operator_delete(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      iVar17 = 0;
      cv::waitKey(0);
      cv::Mat::~Mat((Mat *)&picked);
      std::vector<Object,_std::allocator<Object>_>::~vector(&objects);
    }
    else {
      fprintf(_stderr,"cv::imread %s failed\n",pcVar9);
      iVar17 = -1;
    }
    cv::Mat::~Mat(&m);
  }
  else {
    main_cold_1();
    iVar17 = -1;
  }
  return iVar17;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        fprintf(stderr, "Usage: %s [imagepath]\n", argv[0]);
        return -1;
    }

    const char* imagepath = argv[1];

    cv::Mat m = cv::imread(imagepath, 1);
    if (m.empty())
    {
        fprintf(stderr, "cv::imread %s failed\n", imagepath);
        return -1;
    }

    std::vector<Object> objects;
    detect_yolact(m, objects);

    draw_objects(m, objects);

    return 0;
}